

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

finish_with __thiscall cppwinrt::wrap_lean_and_mean(cppwinrt *this,writer *w,bool is_lean_and_mean)

{
  cppwinrt *__n;
  void *__buf;
  _func_void_writer_ptr *extraout_RDX;
  _func_void_writer_ptr *extraout_RDX_00;
  _func_void_writer_ptr *p_Var1;
  finish_with fVar2;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  char *local_28;
  char *format;
  writer *pwStack_18;
  bool is_lean_and_mean_local;
  writer *w_local;
  
  format._7_1_ = is_lean_and_mean;
  pwStack_18 = w;
  w_local = (writer *)this;
  if (is_lean_and_mean) {
    local_28 = "#ifndef WINRT_LEAN_AND_MEAN\n";
    __n = this;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"#ifndef WINRT_LEAN_AND_MEAN\n");
    writer_base<cppwinrt::writer>::write
              (&w->super_writer_base<cppwinrt::writer>,(int)&local_38,__buf,(size_t)__n);
    finish_with::finish_with((finish_with *)this,pwStack_18,write_endif);
    p_Var1 = extraout_RDX;
  }
  else {
    finish_with::finish_with((finish_with *)this,w,write_nothing);
    p_Var1 = extraout_RDX_00;
  }
  fVar2.finisher = p_Var1;
  fVar2.w = (writer *)this;
  return fVar2;
}

Assistant:

[[nodiscard]] static finish_with wrap_lean_and_mean(writer& w, bool is_lean_and_mean = true)
    {
        if (is_lean_and_mean)
        {
            auto format = R"(#ifndef WINRT_LEAN_AND_MEAN
)";

            w.write(format);

            return { w, write_endif };
        }
        else
        {
            return { w, write_nothing };
        }
    }